

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void * lj_mem_realloc(lua_State *L,void *p,MSize osz,MSize nsz)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  pvVar1 = (void *)(**(code **)(uVar2 + 0x10))(*(undefined8 *)(uVar2 + 0x18),p,osz,nsz);
  if ((nsz != 0) && (pvVar1 == (void *)0x0)) {
    lj_err_mem(L);
  }
  *(int *)(uVar2 + 0x20) = *(int *)(uVar2 + 0x20) + (nsz - osz);
  return pvVar1;
}

Assistant:

void *lj_mem_realloc(lua_State *L, void *p, MSize osz, MSize nsz)
{
  global_State *g = G(L);
  lua_assert((osz == 0) == (p == NULL));
  p = g->allocf(g->allocd, p, osz, nsz);
  if (p == NULL && nsz > 0)
    lj_err_mem(L);
  lua_assert((nsz == 0) == (p == NULL));
  lua_assert(checkptr32(p));
  g->gc.total = (g->gc.total - osz) + nsz;
  return p;
}